

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void CLI::detail::append_codepoint(string *str,uint32_t code)

{
  byte bVar1;
  invalid_argument *this;
  
  if (0x7f < code) {
    if (code < 0x800) {
      bVar1 = (byte)(code >> 6) | 0xc0;
    }
    else {
      if (code < 0x10000) {
        if ((code & 0xf800) == 0xd800) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::invalid_argument::invalid_argument(this,"[0xD800, 0xDFFF] are not valid UTF-8.");
          __cxa_throw(this,&::std::invalid_argument::typeinfo,
                      ::std::invalid_argument::~invalid_argument);
        }
        bVar1 = (byte)(code >> 0xc) | 0xe0;
      }
      else {
        if (0x10ffff < code) {
          return;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (str,(byte)(code >> 0x12) | 0xf0);
        bVar1 = (byte)(code >> 0xc) & 0x3f | 0x80;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (str,bVar1);
      bVar1 = (byte)(code >> 6) & 0x3f | 0x80;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (str,bVar1);
    code = (uint32_t)((byte)code & 0x3f | 0x80);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (str,(char)code);
  return;
}

Assistant:

CLI11_INLINE void append_codepoint(std::string &str, std::uint32_t code) {
    if(code < 0x80) {  // ascii code equivalent
        str.push_back(static_cast<char>(code));
    } else if(code < 0x800) {  // \u0080 to \u07FF
        // 110yyyyx 10xxxxxx; 0x3f == 0b0011'1111
        str.push_back(make_char(0xC0 | code >> 6));
        str.push_back(make_char(0x80 | (code & 0x3F)));
    } else if(code < 0x10000) {  // U+0800...U+FFFF
        if(0xD800 <= code && code <= 0xDFFF) {
            throw std::invalid_argument("[0xD800, 0xDFFF] are not valid UTF-8.");
        }
        // 1110yyyy 10yxxxxx 10xxxxxx
        str.push_back(make_char(0xE0 | code >> 12));
        str.push_back(make_char(0x80 | (code >> 6 & 0x3F)));
        str.push_back(make_char(0x80 | (code & 0x3F)));
    } else if(code < 0x110000) {  // U+010000 ... U+10FFFF
        // 11110yyy 10yyxxxx 10xxxxxx 10xxxxxx
        str.push_back(make_char(0xF0 | code >> 18));
        str.push_back(make_char(0x80 | (code >> 12 & 0x3F)));
        str.push_back(make_char(0x80 | (code >> 6 & 0x3F)));
        str.push_back(make_char(0x80 | (code & 0x3F)));
    }
}